

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O3

STAmount *
jbcoin::mulRound(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2,Issue *issue,
                bool roundUp)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  bool *pbVar7;
  byte bVar8;
  uint64_t rounding;
  mantissa_type mVar9;
  mantissa_type mVar10;
  exponent_type eVar11;
  mantissa_type mVar12;
  exponent_type eVar13;
  bool bVar14;
  bool native;
  bool bVar15;
  STAmount result;
  int local_84;
  uint64_t local_80;
  STAmount local_78;
  
  if ((v1->mValue == 0) || (v2->mValue == 0)) {
    (__return_storage_ptr__->super_STBase).fName = (SField *)sfGeneric;
    (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d2fc0;
    uVar2 = *(undefined8 *)((issue->currency).pn + 2);
    uVar3 = *(undefined8 *)((issue->currency).pn + 4);
    uVar4 = *(undefined8 *)((issue->account).pn + 1);
    *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
         *(undefined8 *)(issue->currency).pn;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar2;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar4;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
         *(undefined8 *)((issue->account).pn + 3);
    __return_storage_ptr__->mValue = 0;
    __return_storage_ptr__->mOffset = 0;
  }
  else {
    local_78.super_STBase.fName = (SField *)sfGeneric;
    local_78.super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002d2fc0;
    local_78.mIssue.currency.pn._0_8_ = *(undefined8 *)(issue->currency).pn;
    local_78.mIssue.currency.pn._8_8_ = *(undefined8 *)((issue->currency).pn + 2);
    local_78.mIssue._16_8_ = *(undefined8 *)((issue->currency).pn + 4);
    local_78.mIssue.account.pn._4_8_ = *(undefined8 *)((issue->account).pn + 1);
    local_78.mIssue.account.pn._12_8_ = *(undefined8 *)((issue->account).pn + 3);
    local_78.mValue._0_6_ = 0;
    local_78.mValue._6_2_ = 0;
    local_78.mOffset = 0;
    local_78.mIsNegative = false;
    STAmount::canonicalize(&local_78);
    if (local_78.mIssue.currency.pn[0] == 0) {
      uVar5 = 0;
      do {
        uVar6 = uVar5;
        if (uVar6 == 4) break;
        uVar5 = uVar6 + 1;
      } while (local_78.mIssue.currency.pn[uVar6 + 1] == 0);
      native = 3 < uVar6;
    }
    else {
      native = false;
    }
    if (v1->mIsNative == false) {
      mVar10 = v1->mValue;
      uVar5 = v2->mValue;
      eVar13 = v1->mOffset;
      eVar11 = v2->mOffset;
      bVar8 = v2->mIsNative;
    }
    else {
      bVar8 = v2->mIsNative;
      if ((native & bVar8) == 1) {
        uVar5 = -v1->mValue;
        if (v1->mIsNegative == false) {
          uVar5 = v1->mValue;
        }
        mVar10 = -v2->mValue;
        if (v2->mIsNegative == false) {
          mVar10 = v2->mValue;
        }
        mVar9 = mVar10;
        if ((long)uVar5 < (long)mVar10) {
          mVar9 = uVar5;
        }
        if (mVar9 < 0xb2d05e01) {
          mVar12 = mVar10;
          if ((long)mVar10 < (long)uVar5) {
            mVar12 = uVar5;
          }
          if ((mVar12 >> 0x20) * mVar9 < 0x7ce66c51) {
            (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
            (__return_storage_ptr__->super_STBase)._vptr_STBase =
                 (_func_int **)&PTR__STBase_002d2fc0;
            (__return_storage_ptr__->mIssue).currency.pn[0] = 0;
            (__return_storage_ptr__->mIssue).currency.pn[1] = 0;
            (__return_storage_ptr__->mIssue).currency.pn[2] = 0;
            (__return_storage_ptr__->mIssue).currency.pn[3] = 0;
            *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = 0;
            (__return_storage_ptr__->mIssue).account.pn[1] = 0;
            (__return_storage_ptr__->mIssue).account.pn[2] = 0;
            (__return_storage_ptr__->mIssue).account.pn[3] = 0;
            (__return_storage_ptr__->mIssue).account.pn[4] = 0;
            __return_storage_ptr__->mValue = mVar10 * uVar5;
            __return_storage_ptr__->mOffset = 0;
            __return_storage_ptr__->mIsNative = true;
            __return_storage_ptr__->mIsNegative = false;
            return __return_storage_ptr__;
          }
        }
        Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"Native value overflow");
      }
      uVar6 = v1->mValue;
      uVar5 = v2->mValue;
      eVar13 = v1->mOffset;
      eVar11 = v2->mOffset;
      mVar10 = uVar6;
      if (uVar6 < 1000000000000000) {
        do {
          mVar10 = uVar6 * 10;
          eVar13 = eVar13 + -1;
          bVar15 = uVar6 < 100000000000000;
          uVar6 = mVar10;
        } while (bVar15);
      }
    }
    if ((uVar5 < 1000000000000000) && (uVar6 = uVar5, (bVar8 & 1) != 0)) {
      do {
        uVar5 = uVar6 * 10;
        eVar11 = eVar11 + -1;
        bVar15 = uVar6 < 100000000000000;
        uVar6 = uVar5;
      } while (bVar15);
    }
    bVar15 = v1->mIsNegative;
    bVar1 = v2->mIsNegative;
    bVar14 = (bVar15 != bVar1) != roundUp;
    rounding = 0;
    if (bVar14) {
      rounding = 99999999999999;
    }
    local_80 = muldiv_round(mVar10,uVar5,100000000000000,rounding);
    local_84 = eVar13 + 0xe + eVar11;
    if (bVar14) {
      canonicalizeRound(native,&local_80,&local_84);
    }
    local_78.mIsNegative = bVar15 != bVar1;
    local_78.super_STBase.fName = (SField *)sfGeneric;
    local_78.super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002d2fc0;
    local_78.mIssue.currency.pn._0_8_ = *(undefined8 *)(issue->currency).pn;
    local_78.mIssue.currency.pn._8_8_ = *(undefined8 *)((issue->currency).pn + 2);
    local_78.mIssue._16_8_ = *(undefined8 *)((issue->currency).pn + 4);
    local_78.mIssue.account.pn._4_8_ = *(undefined8 *)((issue->account).pn + 1);
    local_78.mIssue.account.pn._12_8_ = *(undefined8 *)((issue->account).pn + 3);
    local_78.mValue._0_6_ = (undefined6)local_80;
    local_78.mValue._6_2_ = (undefined2)(local_80 >> 0x30);
    local_78.mOffset = local_84;
    STAmount::canonicalize(&local_78);
    if ((((bVar15 != bVar1) || (!roundUp)) ||
        (CONCAT26(local_78.mValue._6_2_,(undefined6)local_78.mValue) != 0)) ||
       (pbVar7 = LocalValue<bool>::operator*((LocalValue<bool> *)&stAmountCalcSwitchover),
       *pbVar7 != true)) {
      (__return_storage_ptr__->super_STBase).fName = local_78.super_STBase.fName;
      (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d2fc0;
      *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
           local_78.mIssue.currency.pn._0_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) =
           local_78.mIssue.currency.pn._8_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = local_78.mIssue._16_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) =
           local_78.mIssue.account.pn._4_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
           local_78.mIssue.account.pn._12_8_;
      __return_storage_ptr__->mValue = CONCAT26(local_78.mValue._6_2_,(undefined6)local_78.mValue);
      *(ulong *)((long)&__return_storage_ptr__->mValue + 6) =
           CONCAT17(local_78.mIsNegative,
                    CONCAT16(local_78.mIsNative,CONCAT42(local_78.mOffset,local_78.mValue._6_2_)));
      return __return_storage_ptr__;
    }
    if ((native == false) ||
       (pbVar7 = LocalValue<bool>::operator*((LocalValue<bool> *)&stAmountCalcSwitchover2),
       *pbVar7 == false)) {
      eVar13 = -0x60;
      mVar10 = 1000000000000000;
    }
    else {
      eVar13 = 0;
      mVar10 = 1;
    }
    (__return_storage_ptr__->super_STBase).fName = (SField *)sfGeneric;
    (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d2fc0;
    uVar2 = *(undefined8 *)((issue->currency).pn + 2);
    uVar3 = *(undefined8 *)((issue->currency).pn + 4);
    uVar4 = *(undefined8 *)((issue->account).pn + 1);
    *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
         *(undefined8 *)(issue->currency).pn;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar2;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar4;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
         *(undefined8 *)((issue->account).pn + 3);
    __return_storage_ptr__->mValue = mVar10;
    __return_storage_ptr__->mOffset = eVar13;
  }
  __return_storage_ptr__->mIsNegative = false;
  STAmount::canonicalize(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

STAmount
mulRound (STAmount const& v1, STAmount const& v2, Issue const& issue,
    bool roundUp)
{
    if (v1 == zero || v2 == zero)
        return {issue};

    bool const xrp = isXRP (issue);

    if (v1.native() && v2.native() && xrp)
    {
        std::uint64_t minV = (getSNValue (v1) < getSNValue (v2)) ?
                getSNValue (v1) : getSNValue (v2);
        std::uint64_t maxV = (getSNValue (v1) < getSNValue (v2)) ?
                getSNValue (v2) : getSNValue (v1);

        if (minV > 3000000000ull) // sqrt(cMaxNative)
            Throw<std::runtime_error> ("Native value overflow");

        if (((maxV >> 32) * minV) > 2095475792ull) // cMaxNative / 2^32
            Throw<std::runtime_error> ("Native value overflow");

        return STAmount (v1.getFName (), minV * maxV);
    }

    std::uint64_t value1 = v1.mantissa(), value2 = v2.mantissa();
    int offset1 = v1.exponent(), offset2 = v2.exponent();

    if (v1.native())
    {
        while (value1 < STAmount::cMinValue)
        {
            value1 *= 10;
            --offset1;
        }
    }

    if (v2.native())
    {
        while (value2 < STAmount::cMinValue)
        {
            value2 *= 10;
            --offset2;
        }
    }

    bool const resultNegative = v1.negative() != v2.negative();

    // We multiply the two mantissas (each is between 10^15
    // and 10^16), so their product is in the 10^30 to 10^32
    // range. Dividing their product by 10^14 maintains the
    // precision, by scaling the result to 10^16 to 10^18.
    //
    // If the we're rounding up, we want to round up away
    // from zero, and if we're rounding down, truncation
    // is implicit.
    std::uint64_t amount = muldiv_round (
        value1, value2, tenTo14,
        (resultNegative != roundUp) ? tenTo14m1 : 0);

    int offset = offset1 + offset2 + 14;
    if (resultNegative != roundUp)
        canonicalizeRound (xrp, amount, offset);
    STAmount result (issue, amount, offset, resultNegative);

    // Control when bugfixes that require switchover dates are enabled
    if (roundUp && !resultNegative && !result && *stAmountCalcSwitchover)
    {
        if (xrp && *stAmountCalcSwitchover2)
        {
            // return the smallest value above zero
            amount = 1;
            offset = 0;
        }
        else
        {
            // return the smallest value above zero
            amount = STAmount::cMinValue;
            offset = STAmount::cMinOffset;
        }
        return STAmount(issue, amount, offset, resultNegative);
    }
    return result;
}